

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.h
# Opt level: O2

void __thiscall
Js::FunctionWithHomeObj<Js::ScriptFunction>::FunctionWithHomeObj
          (FunctionWithHomeObj<Js::ScriptFunction> *this,FunctionProxy *proxy,
          ScriptFunctionType *deferredPrototypeType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  ScriptFunction::ScriptFunction(&this->super_ScriptFunction,proxy,deferredPrototypeType);
  (this->super_ScriptFunction).super_ScriptFunctionBase.super_JavascriptFunction.super_DynamicObject
  .super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_013c4fb0;
  (this->homeObj).ptr = (void *)0x0;
  if ((((proxy->functionInfo).ptr)->attributes & HomeObj) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x3b,"(proxy->GetFunctionInfo()->HasHomeObj())",
                                "proxy->GetFunctionInfo()->HasHomeObj()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

FunctionWithHomeObj(FunctionProxy* proxy, ScriptFunctionType* deferredPrototypeType)
            : BaseClass(proxy, deferredPrototypeType), homeObj(nullptr)
        {
            Assert(proxy->GetFunctionInfo()->HasHomeObj());
        }